

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool absl::HexStringToBytes(string_view hex,Nonnull<std::string_*> bytes)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  reference pcVar4;
  char *pcVar5;
  string *in_RDX;
  int h2;
  int h1;
  iterator bin_p;
  const_iterator hex_p;
  size_t num_bytes;
  string output;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  char *local_68;
  undefined4 local_4c;
  ulong local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40 [4];
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  byte local_1;
  
  local_20 = in_RDX;
  std::__cxx11::string::string((string *)local_40);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  local_48 = sVar3 >> 1;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  if (sVar3 == local_48 * 2) {
    strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
              (in_stack_ffffffffffffff70,
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_68 = std::basic_string_view<char,_std::char_traits<char>_>::cbegin(&local_18);
    local_70._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff70,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      if (!bVar2) break;
      pcVar5 = local_68 + 1;
      cVar1 = *local_68;
      local_68 = local_68 + 2;
      if (((char)(anonymous_namespace)::kHexValueStrict[cVar1] == -1) ||
         ((anonymous_namespace)::kHexValueStrict[*pcVar5] == -1)) {
        __lhs = local_40;
        std::__cxx11::string::begin();
        __gnu_cxx::operator-
                  (__lhs,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        std::__cxx11::string::resize((ulong)__lhs);
        local_1 = 0;
        goto LAB_003b90a4;
      }
      in_stack_ffffffffffffff6f =
           (char)((int)(char)(anonymous_namespace)::kHexValueStrict[cVar1] << 4) +
           (anonymous_namespace)::kHexValueStrict[*pcVar5];
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_70);
      *pcVar4 = in_stack_ffffffffffffff6f;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_70);
    }
    std::__cxx11::string::operator=(local_20,(string *)local_40);
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_003b90a4:
  local_4c = 1;
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool HexStringToBytes(absl::string_view hex,
                      absl::Nonnull<std::string*> bytes) {
  std::string output;

  size_t num_bytes = hex.size() / 2;
  if (hex.size() != num_bytes * 2) {
    return false;
  }

  absl::strings_internal::STLStringResizeUninitialized(&output, num_bytes);
  auto hex_p = hex.cbegin();
  for (std::string::iterator bin_p = output.begin(); bin_p != output.end();
       ++bin_p) {
    int h1 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    int h2 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    if (h1 == -1 || h2 == -1) {
      output.resize(static_cast<size_t>(bin_p - output.begin()));
      return false;
    }
    *bin_p = static_cast<char>((h1 << 4) + h2);
  }

  *bytes = std::move(output);
  return true;
}